

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::
     LPFwriteRows<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *p_lp,ostream *p_output,NameSet *p_rnames,NameSet *p_cnames)

{
  type_conflict5 tVar1;
  int iVar2;
  ulong *puVar3;
  char *pcVar4;
  ostream *poVar5;
  cpp_dec_float<50U,_int,_void> *in_RCX;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lhs;
  int i;
  char name [16];
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffd48;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd50;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd58;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffd60;
  NameSet *in_stack_fffffffffffffd68;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd70;
  int iVar6;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd78;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd88;
  ostream *in_stack_fffffffffffffd90;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd98;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffda0;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffda8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdb0;
  bool local_245;
  ulong local_240;
  undefined1 local_238 [56];
  undefined1 local_200 [56];
  undefined1 local_1c8 [56];
  ulong local_190;
  undefined1 local_184 [56];
  undefined1 local_14c [56];
  undefined1 local_114 [56];
  int local_dc;
  cpp_dec_float<50U,_int,_void> *local_c0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_b0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_a8;
  undefined8 local_a0;
  ulong *local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined1 *local_60;
  undefined8 local_58;
  ulong *local_50;
  undefined1 *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  ulong *local_20;
  undefined8 local_18;
  undefined8 local_10;
  ulong *local_8;
  
  local_c0 = in_RCX;
  local_b0 = in_RSI;
  local_a8 = in_RDI;
  std::operator<<((ostream *)in_RSI,"Subject To\n");
  for (local_dc = 0; iVar6 = local_dc,
      iVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x1b988e), iVar6 < iVar2; local_dc = local_dc + 1) {
    local_40 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::lhs(in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    local_38 = local_114;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48)
    ;
    local_30 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::rhs(in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    local_28 = local_14c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48)
    ;
    puVar3 = (ulong *)infinity();
    local_190 = *puVar3 ^ 0x8000000000000000;
    local_90 = local_184;
    local_98 = &local_190;
    local_a0 = 0;
    local_8 = local_98;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffd60,(double)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50
              );
    tVar1 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffd48,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x1b99b5);
    local_245 = false;
    if (tVar1) {
      local_80 = infinity();
      local_78 = local_1c8;
      local_88 = 0;
      local_10 = local_80;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffffd60,(double)in_stack_fffffffffffffd58,
                 in_stack_fffffffffffffd50);
      tVar1 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffd48,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x1b9a32);
      local_245 = false;
      if (tVar1) {
        local_245 = boost::multiprecision::operator!=
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_fffffffffffffd48,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x1b9a56);
      }
    }
    iVar6 = (int)((ulong)in_stack_fffffffffffffd70 >> 0x20);
    if (local_245 == false) {
      in_stack_fffffffffffffd48 =
           (cpp_dec_float<50U,_int,_void> *)std::operator<<((ostream *)local_b0," ");
      pcVar4 = LPFgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (in_stack_fffffffffffffd78,(int)((ulong)in_stack_fffffffffffffd70 >> 0x20),
                          in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60,
                          (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      poVar5 = std::operator<<((ostream *)in_stack_fffffffffffffd48,pcVar4);
      std::operator<<(poVar5," : ");
      in_stack_fffffffffffffd50 = local_a8;
      in_stack_fffffffffffffd58 = local_b0;
      in_stack_fffffffffffffd60 = local_c0;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::rowVector(local_a8,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      LPFwriteRow<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (in_stack_fffffffffffffdb0,(ostream *)in_stack_fffffffffffffda8,
                 (NameSet *)in_stack_fffffffffffffda0,
                 (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffd98,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_fffffffffffffd90,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_fffffffffffffd88);
    }
    else {
      in_stack_fffffffffffffd68 = (NameSet *)std::operator<<((ostream *)local_b0," ");
      pcVar4 = LPFgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (in_stack_fffffffffffffd78,iVar6,in_stack_fffffffffffffd68,
                          (char *)in_stack_fffffffffffffd60,
                          (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      poVar5 = std::operator<<((ostream *)in_stack_fffffffffffffd68,pcVar4);
      std::operator<<(poVar5,"_1 : ");
      in_stack_fffffffffffffd70 = local_a8;
      in_stack_fffffffffffffd78 = local_b0;
      in_stack_fffffffffffffd88 =
           SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::rowVector(in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      local_68 = infinity();
      local_60 = local_200;
      local_70 = 0;
      local_18 = local_68;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffffd60,(double)in_stack_fffffffffffffd58,
                 in_stack_fffffffffffffd50);
      LPFwriteRow<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (in_stack_fffffffffffffdb0,(ostream *)in_stack_fffffffffffffda8,
                 (NameSet *)in_stack_fffffffffffffda0,
                 (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffd98,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_fffffffffffffd90,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_fffffffffffffd88);
      in_stack_fffffffffffffd90 = std::operator<<((ostream *)local_b0," ");
      pcVar4 = LPFgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (in_stack_fffffffffffffd78,(int)((ulong)in_stack_fffffffffffffd70 >> 0x20),
                          in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60,
                          (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      poVar5 = std::operator<<(in_stack_fffffffffffffd90,pcVar4);
      std::operator<<(poVar5,"_2 : ");
      in_stack_fffffffffffffd98 = local_a8;
      in_stack_fffffffffffffda0 = local_b0;
      in_stack_fffffffffffffda8 = local_c0;
      in_stack_fffffffffffffdb0 =
           (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::rowVector(in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20))
      ;
      puVar3 = (ulong *)infinity();
      local_240 = *puVar3 ^ 0x8000000000000000;
      local_48 = local_238;
      local_50 = &local_240;
      local_58 = 0;
      local_20 = local_50;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffffd60,(double)in_stack_fffffffffffffd58,
                 in_stack_fffffffffffffd50);
      LPFwriteRow<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (in_stack_fffffffffffffdb0,(ostream *)in_stack_fffffffffffffda8,
                 (NameSet *)in_stack_fffffffffffffda0,
                 (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffd98,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_fffffffffffffd90,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_fffffffffffffd88);
    }
  }
  return;
}

Assistant:

static void LPFwriteRows(
   const SPxLPBase<R>& p_lp,       ///< the LP
   std::ostream&          p_output,   ///< output stream
   const NameSet*         p_rnames,   ///< row names
   const NameSet*         p_cnames   ///< column names
)
{

   char name[16];

   p_output << "Subject To\n";

   for(int i = 0; i < p_lp.nRows(); ++i)
   {
      const R lhs = p_lp.lhs(i);
      const R rhs = p_lp.rhs(i);

      if(lhs > R(-infinity) && rhs < R(infinity) && lhs != rhs)
      {
         // ranged row -> write two non-ranged rows
         p_output << " " << LPFgetRowName(p_lp, i, p_rnames, name, i) << "_1 : ";
         LPFwriteRow(p_lp, p_output, p_cnames, p_lp.rowVector(i), lhs, R(infinity));

         p_output << " " << LPFgetRowName(p_lp, i, p_rnames, name, i) << "_2 : ";
         LPFwriteRow(p_lp, p_output, p_cnames, p_lp.rowVector(i), R(-infinity), rhs);
      }
      else
      {
         p_output << " " << LPFgetRowName(p_lp, i, p_rnames, name, i) << " : ";
         LPFwriteRow(p_lp, p_output, p_cnames, p_lp.rowVector(i), lhs, rhs);
      }
   }
}